

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapimin.c
# Opt level: O3

void jpeg_CreateDecompress(j_decompress_ptr cinfo,int version,size_t structsize)

{
  jpeg_error_mgr *pjVar1;
  void *pvVar2;
  jpeg_decomp_master *__s;
  
  cinfo->mem = (jpeg_memory_mgr *)0x0;
  if (version != 0x3e) {
    *(undefined8 *)&cinfo->err->msg_code = 0x3e0000000c;
    (cinfo->err->msg_parm).i[1] = version;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (structsize != 0x278) {
    *(undefined8 *)&cinfo->err->msg_code = 0x27800000015;
    (cinfo->err->msg_parm).i[1] = (int)structsize;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pjVar1 = cinfo->err;
  pvVar2 = cinfo->client_data;
  memset(&cinfo->mem,0,0x270);
  cinfo->err = pjVar1;
  cinfo->client_data = pvVar2;
  cinfo->is_decompressor = 1;
  jinit_memory_mgr((j_common_ptr)cinfo);
  cinfo->progress = (jpeg_progress_mgr *)0x0;
  cinfo->src = (jpeg_source_mgr *)0x0;
  cinfo->marker_list = (jpeg_saved_marker_ptr_conflict)0x0;
  cinfo->quant_tbl_ptrs[0] = (JQUANT_TBL *)0x0;
  cinfo->quant_tbl_ptrs[1] = (JQUANT_TBL *)0x0;
  cinfo->quant_tbl_ptrs[2] = (JQUANT_TBL *)0x0;
  cinfo->quant_tbl_ptrs[3] = (JQUANT_TBL *)0x0;
  cinfo->dc_huff_tbl_ptrs[0] = (JHUFF_TBL *)0x0;
  cinfo->dc_huff_tbl_ptrs[1] = (JHUFF_TBL *)0x0;
  cinfo->dc_huff_tbl_ptrs[2] = (JHUFF_TBL *)0x0;
  cinfo->dc_huff_tbl_ptrs[3] = (JHUFF_TBL *)0x0;
  cinfo->ac_huff_tbl_ptrs[0] = (JHUFF_TBL *)0x0;
  cinfo->ac_huff_tbl_ptrs[1] = (JHUFF_TBL *)0x0;
  cinfo->ac_huff_tbl_ptrs[2] = (JHUFF_TBL *)0x0;
  cinfo->ac_huff_tbl_ptrs[3] = (JHUFF_TBL *)0x0;
  jinit_marker_reader(cinfo);
  jinit_input_controller(cinfo);
  cinfo->global_state = 200;
  __s = (jpeg_decomp_master *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x90);
  cinfo->master = __s;
  memset(__s,0,0x90);
  return;
}

Assistant:

GLOBAL(void)
jpeg_CreateDecompress(j_decompress_ptr cinfo, int version, size_t structsize)
{
  int i;

  /* Guard against version mismatches between library and caller. */
  cinfo->mem = NULL;            /* so jpeg_destroy knows mem mgr not called */
  if (version != JPEG_LIB_VERSION)
    ERREXIT2(cinfo, JERR_BAD_LIB_VERSION, JPEG_LIB_VERSION, version);
  if (structsize != sizeof(struct jpeg_decompress_struct))
    ERREXIT2(cinfo, JERR_BAD_STRUCT_SIZE,
             (int)sizeof(struct jpeg_decompress_struct), (int)structsize);

  /* For debugging purposes, we zero the whole master structure.
   * But the application has already set the err pointer, and may have set
   * client_data, so we have to save and restore those fields.
   * Note: if application hasn't set client_data, tools like Purify may
   * complain here.
   */
  {
    struct jpeg_error_mgr *err = cinfo->err;
    void *client_data = cinfo->client_data; /* ignore Purify complaint here */
    MEMZERO(cinfo, sizeof(struct jpeg_decompress_struct));
    cinfo->err = err;
    cinfo->client_data = client_data;
  }
  cinfo->is_decompressor = TRUE;

  /* Initialize a memory manager instance for this object */
  jinit_memory_mgr((j_common_ptr)cinfo);

  /* Zero out pointers to permanent structures. */
  cinfo->progress = NULL;
  cinfo->src = NULL;

  for (i = 0; i < NUM_QUANT_TBLS; i++)
    cinfo->quant_tbl_ptrs[i] = NULL;

  for (i = 0; i < NUM_HUFF_TBLS; i++) {
    cinfo->dc_huff_tbl_ptrs[i] = NULL;
    cinfo->ac_huff_tbl_ptrs[i] = NULL;
  }

  /* Initialize marker processor so application can override methods
   * for COM, APPn markers before calling jpeg_read_header.
   */
  cinfo->marker_list = NULL;
  jinit_marker_reader(cinfo);

  /* And initialize the overall input controller. */
  jinit_input_controller(cinfo);

  /* OK, I'm ready */
  cinfo->global_state = DSTATE_START;

  /* The master struct is used to store extension parameters, so we allocate it
   * here.
   */
  cinfo->master = (struct jpeg_decomp_master *)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_PERMANENT,
                                sizeof(my_decomp_master));
  MEMZERO(cinfo->master, sizeof(my_decomp_master));
}